

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O3

void __thiscall
PenguinV_Image::ImageTemplate<signed_char>::fill(ImageTemplate<signed_char> *this,char value)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  FunctionFacade *this_00;
  _func_void_char_ptr_char_unsigned_long *UNRECOVERED_JUMPTABLE;
  
  pcVar3 = this->_data;
  if (pcVar3 != (char *)0x0) {
    uVar1 = this->_height;
    uVar2 = this->_rowSize;
    this_00 = FunctionFacade::instance();
    UNRECOVERED_JUMPTABLE =
         __PenguinV_Image__ImageTemplate<signed_char>__FunctionFacade___getFunction<void(*)(signed_char*,signed_char,unsigned_long)>_std__vector<void(*)(signed_char*,signed_char,unsigned_long),std::allocator<void(*)(signed_char*,signed_char,unsigned_long)>>const__unsigned_char_const_
                   (this_00,&this_00->_set,this->_type);
    (*UNRECOVERED_JUMPTABLE)(pcVar3,value,(ulong)uVar2 * (ulong)uVar1);
    return;
  }
  return;
}

Assistant:

bool empty() const
        {
            return _data == nullptr;
        }